

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFiltersExport.cpp
# Opt level: O2

void helicsFilterAddDestinationTarget(HelicsFilter filt,char *dest,HelicsError *err)

{
  Filter *this;
  size_t sVar1;
  string_view newTarget;
  
  this = anon_unknown.dwarf_a089a::getFilter(filt,err);
  if (this != (Filter *)0x0) {
    if (dest == (char *)0x0) {
      if (err != (HelicsError *)0x0) {
        err->error_code = -4;
        err->message = "The supplied string argument is null and therefore invalid";
      }
    }
    else {
      sVar1 = strlen(dest);
      newTarget._M_str = dest;
      newTarget._M_len = sVar1;
      helics::Interface::addDestinationTarget(&this->super_Interface,newTarget,UNKNOWN);
    }
  }
  return;
}

Assistant:

void helicsFilterAddDestinationTarget(HelicsFilter filt, const char* dest, HelicsError* err)
{
    auto* filter = getFilter(filt, err);
    if (filter == nullptr) {
        return;
    }
    CHECK_NULL_STRING(dest, void());
    try {
        filter->addDestinationTarget(dest);
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
    }
    // LCOV_EXCL_STOP
}